

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *samplings;
  double *pdVar1;
  _Base_ptr p_Var2;
  float fVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar5;
  ShaderExecutor *pSVar6;
  Variable<tcu::Vector<float,_2>_> *pVVar7;
  pointer pcVar8;
  Variable<float> *pVVar9;
  double dVar10;
  TestLog *pTVar11;
  pointer pVVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  _Rb_tree_node_base *p_Var16;
  IVal *pIVar17;
  IVal *x;
  undefined8 *puVar18;
  Vector<float,_2> *val;
  size_t sVar19;
  long lVar20;
  long lVar21;
  undefined8 uVar22;
  _Base_ptr p_Var23;
  undefined1 auVar24 [8];
  IVal IVar25;
  double *pdVar26;
  long lVar27;
  TestStatus *pTVar28;
  double dVar29;
  IVal reference1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  IVal in0;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> outputs;
  void *outputArr [2];
  FloatFormat highpFmt;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  deUint32 in_stack_fffffffffffffac8;
  IVal local_529;
  undefined1 local_528 [8];
  undefined1 local_520 [24];
  _Rb_tree_node_base *local_508;
  size_t local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4f8;
  string local_4f0;
  size_t local_4d0;
  ulong local_4c8;
  FloatFormat *local_4c0;
  TestLog *local_4b8;
  double dStack_4b0;
  _Base_ptr p_Stack_4a8;
  TestStatus *local_4a0;
  undefined1 local_498 [8];
  double dStack_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_488;
  Vector<float,_2> *local_478;
  double dStack_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_468;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_318;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> local_2e8;
  pointer local_2b8;
  pointer local_2b0;
  FloatFormat local_2a8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  IVal local_1f8 [2];
  ios_base local_188 [264];
  ResultCollector local_80;
  
  this_00 = this->m_samplings;
  samplings = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar19 = (this->m_caseCtx).numRandoms;
  local_4a0 = __return_storage_ptr__;
  iVar14 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4c0 = samplings;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)samplings,(FloatFormat *)(ulong)PVar4,(Precision)sVar19,(ulong)(iVar14 + 0xdeadbeef)
             ,in_stack_fffffffffffffac8);
  pVVar12 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar19 = (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2e8,sVar19);
  local_2a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_318._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_318._M_impl.super__Rb_tree_header._M_header;
  local_318._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318._M_impl.super__Rb_tree_header._M_header._M_right =
       local_318._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_4f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2b0 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_498 = (undefined1  [8])local_4f8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_490,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  local_520._0_4_ = _S_red;
  local_520._8_8_ = (_Base_ptr)0x0;
  local_500 = 0;
  pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_520._16_8_ = (_Rb_tree_node_base *)local_520;
  local_508 = (_Rb_tree_node_base *)local_520;
  local_4d0 = sVar19;
  (*pSVar5->_vptr_Statement[4])(pSVar5,local_528);
  if ((_Rb_tree_node_base *)local_520._16_8_ != (_Rb_tree_node_base *)local_520) {
    p_Var16 = (_Rb_tree_node_base *)local_520._16_8_;
    do {
      (**(code **)(**(long **)(p_Var16 + 1) + 0x30))(*(long **)(p_Var16 + 1),local_1f8);
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != (_Rb_tree_node_base *)local_520);
  }
  sVar19 = local_4d0;
  if (local_500 != 0) {
    local_498 = (undefined1  [8])local_4f8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_490,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_490,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_528);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar6 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar6->_vptr_ShaderExecutor[2])(pSVar6,sVar19 & 0xffffffff,&local_218,&local_2b8,0);
  local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffffffffff00);
  dStack_490 = INFINITY;
  aStack_488._M_allocated_capacity = 0xfff0000000000000;
  aStack_488._8_8_ = aStack_488._8_8_ & 0xffffffffffffff00;
  local_478 = (Vector<float,_2> *)0x7ff0000000000000;
  dStack_470 = -INFINITY;
  local_1f8[0].m_data[0]._0_8_ = local_1f8[0].m_data[0]._0_8_ & 0xffffffffffffff00;
  local_1f8[0].m_data[0].m_lo = INFINITY;
  local_1f8[0].m_data[0].m_hi = -INFINITY;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_318,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_498);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_528);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4f0);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4b8);
  Environment::bind<float>
            ((Environment *)&local_318,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,local_1f8[0].m_data);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_529);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar12) {
LAB_00865b37:
    local_498 = (undefined1  [8])local_4f8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"All ",4);
    pTVar28 = local_4a0;
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
    local_498 = (undefined1  [8])&aStack_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"Pass","");
    pTVar28->m_code = QP_TEST_RESULT_PASS;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_498,
               (char *)((long)local_498 + (long)dStack_490));
    uVar22 = aStack_488._M_allocated_capacity;
    auVar24 = local_498;
    if (local_498 == (undefined1  [8])&aStack_488) goto LAB_00865d16;
  }
  else {
    lVar21 = sVar19 + (sVar19 == 0);
    lVar27 = 0;
    lVar20 = 0;
    local_4c8 = 0;
    do {
      local_4b8 = (TestLog *)((ulong)local_4b8 & 0xffffffffffffff00);
      dStack_4b0 = INFINITY;
      p_Stack_4a8 = (_Base_ptr)0xfff0000000000000;
      local_528._0_4_ =
           *(float *)((long)(local_278.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar20);
      local_528._4_4_ =
           *(float *)((long)(local_278.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar20 + 4);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                (local_1f8,local_4c0,(Vector<float,_2> *)local_528);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_498,local_4c0,local_1f8);
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_318,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar17->m_data[1].m_lo = (double)local_478;
      pIVar17->m_data[1].m_hi = dStack_470;
      pIVar17->m_data[0].m_hi = (double)aStack_488._M_allocated_capacity;
      *(undefined8 *)(pIVar17->m_data + 1) = aStack_488._8_8_;
      pIVar17->m_data[0].m_hasNaN = local_498;
      pIVar17->m_data[0].m_lo = dStack_490;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      val = (Vector<float,_2> *)local_4c0->m_maxValue;
      local_498 = *(undefined1 (*) [8])local_4c0;
      dStack_490 = *(double *)&local_4c0->m_fractionBits;
      aStack_488._M_allocated_capacity = *(undefined8 *)&local_4c0->m_hasInf;
      aStack_488._8_8_ = *(undefined8 *)&local_4c0->m_exactPrecision;
      dStack_470 = (double)CONCAT44(dStack_470._4_4_,(this->m_caseCtx).precision);
      local_460 = 0;
      pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_478 = val;
      local_468 = &local_318;
      (*pSVar5->_vptr_Statement[3])(pSVar5,local_498);
      x = Environment::lookup<float>
                    ((Environment *)&local_318,
                     (this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_498,&local_2a8,x);
      p_Stack_4a8 = (_Base_ptr)aStack_488._M_allocated_capacity;
      local_4b8 = (TestLog *)local_498;
      pTVar11 = local_4b8;
      dStack_4b0 = dStack_490;
      fVar3 = *(float *)((long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar27);
      dVar29 = (double)fVar3;
      dVar10 = dVar29;
      if (NAN(fVar3)) {
        dVar10 = INFINITY;
        dVar29 = -INFINITY;
      }
      IVar25 = (IVal)(dVar29 <= (double)aStack_488._M_allocated_capacity && dStack_490 <= dVar10);
      if ((NAN(fVar3)) &&
         (dVar29 <= (double)aStack_488._M_allocated_capacity && dStack_490 <= dVar10)) {
        local_4b8._0_1_ = local_498[0];
        IVar25 = local_4b8._0_1_;
      }
      local_498 = (undefined1  [8])&aStack_488;
      local_4b8 = pTVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(&local_80,(bool)((byte)IVar25 & 1),(string *)local_498);
      if (local_498 != (undefined1  [8])&aStack_488) {
        operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
      }
      if (!bVar13) {
        uVar15 = (int)local_4c8 + 1;
        local_4c8 = (ulong)uVar15;
        pdVar26 = &local_1f8[0].m_data[0].m_hi;
        if ((int)uVar15 < 0x65) {
          local_498 = (undefined1  [8])local_4f8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
          pVVar7 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_1f8[0].m_data[0]._0_8_ = pdVar26;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1f8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)local_1f8[0].m_data[0]._0_8_,
                     (long)local_1f8[0].m_data[0].m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_528,(shaderexecutor *)&local_2a8,
                     (FloatFormat *)
                     ((long)(local_278.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar20),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)CONCAT44(local_528._4_4_,local_528._0_4_),
                     CONCAT44(local_520._4_4_,local_520._0_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
          if ((undefined1 *)CONCAT44(local_528._4_4_,local_528._0_4_) != local_520 + 8) {
            operator_delete((undefined1 *)CONCAT44(local_528._4_4_,local_528._0_4_),
                            (ulong)(local_520._8_8_ + 1));
          }
          if ((double *)local_1f8[0].m_data[0]._0_8_ != pdVar26) {
            operator_delete((void *)local_1f8[0].m_data[0]._0_8_,
                            (long)local_1f8[0].m_data[0].m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
          pVVar9 = (this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar8 = (pVVar9->m_name)._M_dataplus._M_p;
          local_1f8[0].m_data[0]._0_8_ = pdVar26;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1f8,pcVar8,pcVar8 + (pVVar9->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)local_1f8[0].m_data[0]._0_8_,
                     (long)local_1f8[0].m_data[0].m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
          valueToString<float>
                    ((string *)local_528,&local_2a8,
                     (float *)((long)local_2e8.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar27));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)CONCAT44(local_528._4_4_,local_528._0_4_),
                     CONCAT44(local_520._4_4_,local_520._0_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,"\tExpected range: ",0x11);
          intervalToString<float>(&local_4f0,&local_2a8,(IVal *)&local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
            operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)CONCAT44(local_528._4_4_,local_528._0_4_) != local_520 + 8) {
            operator_delete((undefined1 *)CONCAT44(local_528._4_4_,local_528._0_4_),
                            (ulong)(local_520._8_8_ + 1));
          }
          if ((double *)local_1f8[0].m_data[0]._0_8_ != pdVar26) {
            operator_delete((void *)local_1f8[0].m_data[0]._0_8_,
                            (long)local_1f8[0].m_data[0].m_hi + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
          std::ios_base::~ios_base(local_420);
        }
      }
      pdVar26 = &local_1f8[0].m_data[0].m_hi;
      lVar20 = lVar20 + 8;
      lVar27 = lVar27 + 4;
      lVar21 = lVar21 + -1;
    } while (lVar21 != 0);
    iVar14 = (int)local_4c8;
    if (iVar14 < 0x65) {
      if (iVar14 == 0) goto LAB_00865b37;
    }
    else {
      local_498 = (undefined1  [8])local_4f8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_490,iVar14 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
      std::ios_base::~ios_base(local_420);
    }
    local_498 = (undefined1  [8])local_4f8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::ostream::operator<<((ostringstream *)&dStack_490,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::ostream::operator<<(local_498,iVar14);
    pTVar28 = local_4a0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    local_498 = (undefined1  [8])&aStack_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)((long)dStack_490 + CONCAT44(local_520._4_4_,local_520._0_4_));
    p_Var23 = (_Base_ptr)0xf;
    if ((undefined1 *)CONCAT44(local_528._4_4_,local_528._0_4_) != local_520 + 8) {
      p_Var23 = (_Base_ptr)local_520._8_8_;
    }
    if (p_Var23 < p_Var2) {
      uVar22 = (_Base_ptr)0xf;
      if (local_498 != (undefined1  [8])&aStack_488) {
        uVar22 = aStack_488._M_allocated_capacity;
      }
      if ((ulong)uVar22 < p_Var2) goto LAB_00865b28;
      puVar18 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_498,0,(char *)0x0,CONCAT44(local_528._4_4_,local_528._0_4_))
      ;
    }
    else {
LAB_00865b28:
      puVar18 = (undefined8 *)std::__cxx11::string::_M_append(local_528,(ulong)local_498);
    }
    pdVar1 = (double *)(puVar18 + 2);
    if ((double *)*puVar18 == pdVar1) {
      local_1f8[0].m_data[0].m_hi = *pdVar1;
      local_1f8[0].m_data[1]._0_4_ = *(undefined4 *)(puVar18 + 3);
      local_1f8[0].m_data[1]._4_4_ = *(undefined4 *)((long)puVar18 + 0x1c);
      local_1f8[0].m_data[0]._0_8_ = pdVar26;
    }
    else {
      local_1f8[0].m_data[0].m_hi = *pdVar1;
      local_1f8[0].m_data[0]._0_8_ = (double *)*puVar18;
    }
    local_1f8[0].m_data[0].m_lo = (double)puVar18[1];
    *puVar18 = pdVar1;
    puVar18[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar28->m_code = QP_TEST_RESULT_FAIL;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_1f8[0].m_data[0]._0_8_,
               (undefined1 *)((long)local_1f8[0].m_data[0].m_lo + local_1f8[0].m_data[0]._0_8_));
    if ((double *)local_1f8[0].m_data[0]._0_8_ != pdVar26) {
      operator_delete((void *)local_1f8[0].m_data[0]._0_8_,(long)local_1f8[0].m_data[0].m_hi + 1);
    }
    if (local_498 != (undefined1  [8])&aStack_488) {
      operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
    }
    auVar24 = (undefined1  [8])CONCAT44(local_528._4_4_,local_528._0_4_);
    uVar22 = local_520._8_8_;
    if (auVar24 == (undefined1  [8])(local_520 + 8)) goto LAB_00865d16;
  }
  operator_delete((void *)auVar24,(ulong)((long)&((_Base_ptr)uVar22)->_M_color + 1));
LAB_00865d16:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_318);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar28;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}